

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O0

void __thiscall QPDFPageDocumentHelper::removeUnreferencedResources(QPDFPageDocumentHelper *this)

{
  bool bVar1;
  reference this_00;
  QPDFPageObjectHelper *ph;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  QPDFPageDocumentHelper *this_local;
  
  getAllPages((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1,this)
  ;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                     ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                      &__begin1);
  ph = (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end
                 ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&ph);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
              ::operator*(&__end1);
    QPDFPageObjectHelper::removeUnreferencedResources(this_00);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__begin1);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::removeUnreferencedResources()
{
    for (auto& ph: getAllPages()) {
        ph.removeUnreferencedResources();
    }
}